

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O1

shared_ptr<duckdb::ParquetFileMetadataCache,_true> __thiscall
duckdb::LoadMetadata
          (duckdb *this,ClientContext *context,Allocator *allocator,CachingFileHandle *file_handle,
          shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *encryption_config,
          EncryptionUtil *encryption_util,optional_idx footer_size)

{
  ThriftFileTransport *this_00;
  ulong file_size;
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  undefined8 uVar6;
  long lVar7;
  pointer pTVar8;
  idx_t iVar9;
  pointer extraout_RAX;
  FileMetaData *this_01;
  FileCryptoMetaData *this_02;
  pointer pFVar10;
  type pFVar11;
  type iprot;
  ParquetEncryptionConfig *this_03;
  string *key;
  pointer pFVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  InvalidInputException *pIVar14;
  size_t __nbytes;
  _List_node_base *p_Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  int iVar17;
  ulong pos;
  iterator __end2;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true> sVar18;
  bool footer_encrypted;
  uint32_t read_footer_len;
  unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
  file_proto;
  unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
  geo_metadata;
  templated_unique_single_t metadata;
  bool local_111;
  _Head_base<0UL,_duckdb_parquet::FileCryptoMetaData_*,_false> local_110;
  CachingFileHandle *local_108;
  _Head_base<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_false> local_100;
  undefined1 local_f8 [40];
  _Alloc_hider local_d0;
  string local_c8;
  EncryptionUtil *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string local_90;
  string local_70;
  string local_50;
  
  local_a8 = encryption_util;
  local_a0._M_allocated_capacity = (size_type)this;
  local_a0._8_8_ = context;
  lVar7 = ::std::chrono::_V2::system_clock::now();
  __nbytes = 0x112e0be826d694b3;
  local_108 = file_handle;
  CreateThriftFileProtocol((duckdb *)&local_100,file_handle,false);
  pTVar8 = unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
           ::operator->((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
                         *)&local_100);
  this_00 = (ThriftFileTransport *)
            (pTVar8->ptrans_).
            super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var13 = (pTVar8->ptrans_).
            super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
    }
    if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
    }
  }
  file_size = this_00->size;
  if (file_size < 0xc) {
    pIVar14 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_f8._0_8_ = local_f8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"File \'%s\' too small to be a Parquet file","");
    CachingFileHandle::GetPath_abi_cxx11_(&local_50,local_108);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar14,(string *)local_f8,&local_50);
    __cxa_throw(pIVar14,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (footer_size.index == 0xffffffffffffffff) {
    local_f8._0_8_ = (data_ptr_t)0x0;
    local_f8._8_8_ = 0;
    AllocatedData::AllocatedData((AllocatedData *)(local_f8 + 0x10));
    local_d0._M_p = (pointer)0x0;
    ResizeableBuffer::resize((ResizeableBuffer *)local_f8,allocator,8);
    switchD_005700f1::default((void *)local_f8._0_8_,0,local_f8._8_8_);
    ThriftFileTransport::Prefetch(this_00,file_size - 8,8);
    this_00->location = file_size - 8;
    ThriftFileTransport::read(this_00,(int)local_f8._0_8_,(void *)0x8,__nbytes);
    uVar3 = local_f8._0_8_;
    CachingFileHandle::GetPath_abi_cxx11_(&local_c8,local_108);
    ParseParquetFooter((data_ptr_t)uVar3,&local_c8,file_size,encryption_config,
                       (uint32_t *)&local_110,&local_111);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    iVar9 = file_size - ((int)local_110._M_head_impl + 8);
    this_00->location = iVar9;
    ThriftFileTransport::Prefetch(this_00,iVar9,(ulong)local_110._M_head_impl & 0xffffffff);
    AllocatedData::~AllocatedData((AllocatedData *)(local_f8 + 0x10));
  }
  else {
    iVar9 = optional_idx::GetIndex((optional_idx *)&read_footer_len);
    iVar17 = (int)iVar9;
    if ((iVar17 == 0) || (file_size < iVar17 + 0xc)) {
      pIVar14 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_f8._0_8_ = local_f8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,"Invalid footer length provided for file \'%s\'","");
      CachingFileHandle::GetPath_abi_cxx11_(&local_70,local_108);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar14,(string *)local_f8,&local_70);
      __cxa_throw(pIVar14,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pos = file_size - (iVar17 + 8);
    this_00->location = pos;
    ThriftFileTransport::Prefetch(this_00,pos,(ulong)(iVar17 + 8));
    local_c8._M_dataplus._M_p = extraout_RAX;
    p_Var15 = (_List_node_base *)&this_00->ra_buffer;
    do {
      p_Var15 = (((list<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_> *)&p_Var15->_M_next)->
                super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>)._M_impl.
                _M_node.super__List_node_base._M_next;
      if ((ReadAheadBuffer *)p_Var15 == &this_00->ra_buffer) {
        local_c8._M_dataplus._M_p = (pointer)0x0;
        break;
      }
      if ((pos < *(ulong *)(p_Var15 + 1)) ||
         (*(ulong *)(p_Var15 + 1) + (long)p_Var15[1]._M_prev <= pos)) {
        bVar2 = true;
      }
      else {
        local_c8._M_dataplus._M_p = (pointer)(p_Var15 + 1);
        bVar2 = false;
      }
    } while (bVar2);
    optional_ptr<duckdb::ReadHead,_true>::CheckValid
              ((optional_ptr<duckdb::ReadHead,_true> *)&local_c8);
    lVar1 = *(long *)(local_c8._M_dataplus._M_p + 0x28);
    CachingFileHandle::GetPath_abi_cxx11_((string *)local_f8,local_108);
    ParseParquetFooter((data_ptr_t)(lVar1 + (iVar9 & 0xffffffff)),(string *)local_f8,file_size,
                       encryption_config,(uint32_t *)&local_110,&local_111);
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_);
    }
    if ((int)local_110._M_head_impl != iVar17) {
      pIVar14 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_f8._0_8_ = local_f8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,
                 "Parquet footer length stored in file is not equal to footer length provided","");
      InvalidInputException::InvalidInputException(pIVar14,(string *)local_f8);
      __cxa_throw(pIVar14,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  this_01 = (FileMetaData *)operator_new(0x170);
  duckdb_parquet::FileMetaData::FileMetaData(this_01);
  local_c8._M_dataplus._M_p = (pointer)this_01;
  if (local_111 == true) {
    this_02 = (FileCryptoMetaData *)operator_new(0xe0);
    duckdb_parquet::FileCryptoMetaData::FileCryptoMetaData(this_02);
    local_110._M_head_impl = this_02;
    pFVar10 = unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
              ::operator->((unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
                            *)&local_110);
    (**(code **)(*(long *)pFVar10 + 0x10))(pFVar10,local_100._M_head_impl);
    pFVar10 = unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
              ::operator->((unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
                            *)&local_110);
    if (((byte)(pFVar10->encryption_algorithm).__isset & 2) != 0) {
      pIVar14 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_f8._0_8_ = local_f8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,
                 "File \'%s\' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",""
                );
      CachingFileHandle::GetPath_abi_cxx11_(&local_90,local_108);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar14,(string *)local_f8,&local_90);
      __cxa_throw(pIVar14,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pFVar11 = unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
              ::operator*((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                           *)&local_c8);
    lVar1 = *(long *)(*(long *)pFVar11 + -0x30);
    iprot = unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
            ::operator*((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
                         *)&local_100);
    this_03 = shared_ptr<const_duckdb::ParquetEncryptionConfig,_true>::operator->(encryption_config)
    ;
    key = ParquetEncryptionConfig::GetFooterKey_abi_cxx11_(this_03);
    ParquetCrypto::Read((TBase *)(&pFVar11->field_0x0 + lVar1),iprot,key,local_a8);
    if (local_110._M_head_impl != (FileCryptoMetaData *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  else {
    pFVar12 = unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
              ::operator->((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                            *)&local_c8);
    (**(code **)(*(long *)pFVar12 + 0x10))(pFVar12,local_100._M_head_impl);
  }
  pFVar11 = unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
            ::operator*((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                         *)&local_c8);
  GeoParquetFileMetadata::TryRead
            ((GeoParquetFileMetadata *)local_f8,pFVar11,(ClientContext *)local_a0._8_8_);
  p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  uVar6 = local_a0._M_allocated_capacity;
  _Var5._M_p = local_c8._M_dataplus._M_p;
  uVar3 = local_f8._0_8_;
  p_Var13->_M_use_count = 1;
  p_Var13->_M_weak_count = 1;
  p_Var13->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_019d54a0;
  local_c8._M_dataplus._M_p = (pointer)0x0;
  local_f8._0_8_ = (GeoParquetFileMetadata *)0x0;
  uVar4 = local_f8._0_8_;
  p_Var13[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ParquetFileMetadataCache_019d54f0;
  *(pointer *)&p_Var13[1]._M_use_count = _Var5._M_p;
  p_Var13[2]._vptr__Sp_counted_base = (_func_int **)(lVar7 / 1000000000);
  local_f8._0_4_ = (undefined4)uVar3;
  local_f8._4_4_ = SUB84(uVar3,4);
  p_Var13[2]._M_use_count = local_f8._0_4_;
  p_Var13[2]._M_weak_count = local_f8._4_4_;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_a0._M_allocated_capacity = p_Var13 + 1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_a0._M_allocated_capacity + 8) = p_Var13;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var13->_M_use_count = 2;
  }
  local_f8._0_8_ = uVar4;
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
  _Var16._M_pi = extraout_RDX;
  if ((GeoParquetFileMetadata *)local_f8._0_8_ != (GeoParquetFileMetadata *)0x0) {
    ::std::default_delete<duckdb::GeoParquetFileMetadata>::operator()
              ((default_delete<duckdb::GeoParquetFileMetadata> *)local_f8,
               (GeoParquetFileMetadata *)local_f8._0_8_);
    _Var16._M_pi = extraout_RDX_00;
  }
  if ((long *)local_c8._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_c8._M_dataplus._M_p + 8))();
    _Var16._M_pi = extraout_RDX_01;
  }
  if (local_100._M_head_impl != (TProtocol *)0x0) {
    (*(local_100._M_head_impl)->_vptr_TProtocol[1])();
    _Var16._M_pi = extraout_RDX_02;
  }
  sVar18.internal.super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var16._M_pi;
  sVar18.internal.super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar6;
  return (shared_ptr<duckdb::ParquetFileMetadataCache,_true>)
         sVar18.internal.
         super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static shared_ptr<ParquetFileMetadataCache>
LoadMetadata(ClientContext &context, Allocator &allocator, CachingFileHandle &file_handle,
             const shared_ptr<const ParquetEncryptionConfig> &encryption_config, const EncryptionUtil &encryption_util,
             optional_idx footer_size) {
	auto current_time = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());

	auto file_proto = CreateThriftFileProtocol(file_handle, false);
	auto &transport = reinterpret_cast<ThriftFileTransport &>(*file_proto->getTransport());
	auto file_size = transport.GetSize();
	if (file_size < 12) {
		throw InvalidInputException("File '%s' too small to be a Parquet file", file_handle.GetPath());
	}

	bool footer_encrypted;
	// footer size is not provided - read it from the back
	if (!footer_size.IsValid()) {
		ResizeableBuffer buf;
		buf.resize(allocator, 8);
		buf.zero();

		transport.Prefetch(file_size - 8, 8);
		transport.SetLocation(file_size - 8);
		transport.read(buf.ptr, 8);

		uint32_t footer_len;
		ParseParquetFooter(buf.ptr, file_handle.GetPath(), file_size, encryption_config, footer_len, footer_encrypted);

		auto metadata_pos = file_size - (footer_len + 8);
		transport.SetLocation(metadata_pos);
		transport.Prefetch(metadata_pos, footer_len);
	} else {
		auto footer_len = UnsafeNumericCast<uint32_t>(footer_size.GetIndex());
		if (footer_len == 0 || file_size < 12 + footer_len) {
			throw InvalidInputException("Invalid footer length provided for file '%s'", file_handle.GetPath());
		}

		idx_t total_footer_len = footer_len + 8;
		auto metadata_pos = file_size - total_footer_len;
		transport.SetLocation(metadata_pos);
		transport.Prefetch(metadata_pos, total_footer_len);

		auto read_head = transport.GetReadHead(metadata_pos);
		auto data_ptr = read_head->buffer_ptr;

		uint32_t read_footer_len;
		ParseParquetFooter(data_ptr + footer_len, file_handle.GetPath(), file_size, encryption_config, read_footer_len,
		                   footer_encrypted);
		if (read_footer_len != footer_len) {
			throw InvalidInputException("Parquet footer length stored in file is not equal to footer length provided");
		}
	}

	auto metadata = make_uniq<FileMetaData>();
	if (footer_encrypted) {
		auto crypto_metadata = make_uniq<FileCryptoMetaData>();
		crypto_metadata->read(file_proto.get());
		if (crypto_metadata->encryption_algorithm.__isset.AES_GCM_CTR_V1) {
			throw InvalidInputException("File '%s' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",
			                            file_handle.GetPath());
		}
		ParquetCrypto::Read(*metadata, *file_proto, encryption_config->GetFooterKey(), encryption_util);
	} else {
		metadata->read(file_proto.get());
	}

	// Try to read the GeoParquet metadata (if present)
	auto geo_metadata = GeoParquetFileMetadata::TryRead(*metadata, context);

	return make_shared_ptr<ParquetFileMetadataCache>(std::move(metadata), current_time, std::move(geo_metadata));
}